

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_loopfilter_sse2.c
# Opt level: O2

void aom_highbd_lpf_vertical_4_sse2
               (uint16_t *s,int p,uint8_t *blimit,uint8_t *limit,uint8_t *thresh,int bd)

{
  ulong uVar1;
  undefined8 uVar2;
  ulong uVar3;
  undefined8 uVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  undefined1 auVar36 [12];
  undefined1 auVar37 [12];
  undefined1 auVar38 [15];
  undefined1 auVar39 [15];
  undefined1 auVar40 [15];
  undefined1 auVar41 [15];
  undefined1 auVar42 [15];
  undefined1 auVar43 [15];
  undefined1 auVar44 [15];
  undefined1 auVar45 [15];
  undefined1 auVar46 [15];
  short sVar47;
  undefined4 uVar48;
  undefined1 auVar50 [16];
  short sVar52;
  undefined1 auVar53 [16];
  undefined1 auVar56 [16];
  short sVar66;
  undefined4 uVar57;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  short sVar67;
  undefined1 auVar68 [16];
  ushort uVar69;
  ushort uVar76;
  ushort uVar77;
  ushort uVar78;
  ushort uVar79;
  ushort uVar80;
  ushort uVar81;
  undefined1 auVar71 [16];
  ushort uVar82;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  __m128i mask;
  __m128i abs_p1p0;
  __m128i q1q0;
  __m128i p1p0;
  __m128i hev;
  __m128i thresh_1;
  __m128i limit_1;
  __m128i blimit_1;
  __m128i pq [2];
  undefined1 auVar49 [12];
  undefined1 auVar51 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar58 [12];
  undefined1 auVar65 [16];
  short sVar70;
  short sVar83;
  
  uVar1 = *(ulong *)(s + -2);
  uVar2 = *(undefined8 *)(s + (long)p + -2);
  auVar56._8_4_ = 0;
  auVar56._0_8_ = uVar1;
  auVar56._12_2_ = (short)(uVar1 >> 0x30);
  auVar56._14_2_ = (short)((ulong)uVar2 >> 0x30);
  auVar50._12_4_ = auVar56._12_4_;
  auVar50._8_2_ = 0;
  auVar50._0_8_ = uVar1;
  auVar50._10_2_ = (short)((ulong)uVar2 >> 0x20);
  auVar68._10_6_ = auVar50._10_6_;
  auVar68._8_2_ = (short)(uVar1 >> 0x20);
  auVar68._0_8_ = uVar1;
  auVar36._4_8_ = auVar68._8_8_;
  auVar36._2_2_ = (short)((ulong)uVar2 >> 0x10);
  auVar36._0_2_ = (short)(uVar1 >> 0x10);
  uVar3 = *(ulong *)(s + (long)(p * 2) + -2);
  uVar4 = *(undefined8 *)(s + (long)(p * 3) + -2);
  auVar55._8_4_ = 0;
  auVar55._0_8_ = uVar3;
  auVar55._12_2_ = (short)(uVar3 >> 0x30);
  auVar55._14_2_ = (short)((ulong)uVar4 >> 0x30);
  auVar54._12_4_ = auVar55._12_4_;
  auVar54._8_2_ = 0;
  auVar54._0_8_ = uVar3;
  auVar54._10_2_ = (short)((ulong)uVar4 >> 0x20);
  auVar53._10_6_ = auVar54._10_6_;
  auVar53._8_2_ = (short)(uVar3 >> 0x20);
  auVar53._0_8_ = uVar3;
  auVar37._4_8_ = auVar53._8_8_;
  auVar37._2_2_ = (short)((ulong)uVar4 >> 0x10);
  auVar37._0_2_ = (short)(uVar3 >> 0x10);
  pq[1][0] = CONCAT44(CONCAT22((short)uVar4,(short)uVar3),CONCAT22((short)uVar2,(short)uVar1));
  pq[0][1]._0_4_ = auVar68._8_4_;
  pq[0][1]._4_4_ = auVar53._8_4_;
  pq[0][0] = CONCAT44(auVar37._0_4_,auVar36._0_4_);
  auVar62 = *(undefined1 (*) [16])blimit;
  auVar19[0xd] = 0;
  auVar19._0_13_ = auVar62._0_13_;
  auVar19[0xe] = auVar62[7];
  auVar22[0xc] = auVar62[6];
  auVar22._0_12_ = auVar62._0_12_;
  auVar22._13_2_ = auVar19._13_2_;
  auVar25[0xb] = 0;
  auVar25._0_11_ = auVar62._0_11_;
  auVar25._12_3_ = auVar22._12_3_;
  auVar28[10] = auVar62[5];
  auVar28._0_10_ = auVar62._0_10_;
  auVar28._11_4_ = auVar25._11_4_;
  auVar31[9] = 0;
  auVar31._0_9_ = auVar62._0_9_;
  auVar31._10_5_ = auVar28._10_5_;
  auVar34[8] = auVar62[4];
  auVar34._0_8_ = auVar62._0_8_;
  auVar34._9_6_ = auVar31._9_6_;
  auVar38._7_8_ = 0;
  auVar38._0_7_ = auVar34._8_7_;
  auVar41._1_8_ = SUB158(auVar38 << 0x40,7);
  auVar41[0] = auVar62[3];
  auVar41._9_6_ = 0;
  auVar42._1_10_ = SUB1510(auVar41 << 0x30,5);
  auVar42[0] = auVar62[2];
  auVar42._11_4_ = 0;
  auVar59._3_12_ = SUB1512(auVar42 << 0x20,3);
  auVar59[2] = auVar62[1];
  auVar59[0] = auVar62[0];
  auVar59[1] = 0;
  auVar59[0xf] = 0;
  auVar68 = ZEXT416(bd - 8);
  blimit_1 = (__m128i)psllw(auVar59,auVar68);
  auVar62 = *(undefined1 (*) [16])limit;
  auVar17[0xd] = 0;
  auVar17._0_13_ = auVar62._0_13_;
  auVar17[0xe] = auVar62[7];
  auVar20[0xc] = auVar62[6];
  auVar20._0_12_ = auVar62._0_12_;
  auVar20._13_2_ = auVar17._13_2_;
  auVar23[0xb] = 0;
  auVar23._0_11_ = auVar62._0_11_;
  auVar23._12_3_ = auVar20._12_3_;
  auVar26[10] = auVar62[5];
  auVar26._0_10_ = auVar62._0_10_;
  auVar26._11_4_ = auVar23._11_4_;
  auVar29[9] = 0;
  auVar29._0_9_ = auVar62._0_9_;
  auVar29._10_5_ = auVar26._10_5_;
  auVar32[8] = auVar62[4];
  auVar32._0_8_ = auVar62._0_8_;
  auVar32._9_6_ = auVar29._9_6_;
  auVar39._7_8_ = 0;
  auVar39._0_7_ = auVar32._8_7_;
  auVar43._1_8_ = SUB158(auVar39 << 0x40,7);
  auVar43[0] = auVar62[3];
  auVar43._9_6_ = 0;
  auVar44._1_10_ = SUB1510(auVar43 << 0x30,5);
  auVar44[0] = auVar62[2];
  auVar44._11_4_ = 0;
  auVar35[2] = auVar62[1];
  auVar35._0_2_ = auVar62._0_2_;
  auVar35._3_12_ = SUB1512(auVar44 << 0x20,3);
  auVar60._0_2_ = auVar62._0_2_ & 0xff;
  auVar60._2_13_ = auVar35._2_13_;
  auVar60[0xf] = 0;
  limit_1 = (__m128i)psllw(auVar60,auVar68);
  auVar62 = *(undefined1 (*) [16])thresh;
  auVar18[0xd] = 0;
  auVar18._0_13_ = auVar62._0_13_;
  auVar18[0xe] = auVar62[7];
  auVar21[0xc] = auVar62[6];
  auVar21._0_12_ = auVar62._0_12_;
  auVar21._13_2_ = auVar18._13_2_;
  auVar24[0xb] = 0;
  auVar24._0_11_ = auVar62._0_11_;
  auVar24._12_3_ = auVar21._12_3_;
  auVar27[10] = auVar62[5];
  auVar27._0_10_ = auVar62._0_10_;
  auVar27._11_4_ = auVar24._11_4_;
  auVar30[9] = 0;
  auVar30._0_9_ = auVar62._0_9_;
  auVar30._10_5_ = auVar27._10_5_;
  auVar33[8] = auVar62[4];
  auVar33._0_8_ = auVar62._0_8_;
  auVar33._9_6_ = auVar30._9_6_;
  auVar40._7_8_ = 0;
  auVar40._0_7_ = auVar33._8_7_;
  auVar45._1_8_ = SUB158(auVar40 << 0x40,7);
  auVar45[0] = auVar62[3];
  auVar45._9_6_ = 0;
  auVar46._1_10_ = SUB1510(auVar45 << 0x30,5);
  auVar46[0] = auVar62[2];
  auVar46._11_4_ = 0;
  auVar61._3_12_ = SUB1512(auVar46 << 0x20,3);
  auVar61[2] = auVar62[1];
  auVar61[0] = auVar62[0];
  auVar61[1] = 0;
  auVar61[0xf] = 0;
  thresh_1 = (__m128i)psllw(auVar61,auVar68);
  auVar62 = ZEXT416((uint)(1 << ((char)bd - 1U & 0x1f)));
  auVar62 = pshuflw(auVar62,auVar62,0);
  uVar48 = auVar62._0_4_;
  highbd_hev_filter_mask_x_sse2(pq,2,&p1p0,&q1q0,&abs_p1p0,&limit_1,&blimit_1,&thresh_1,&hev,&mask);
  auVar62 = psllw(_DAT_0046eab0,ZEXT416((uint)bd));
  auVar63._8_4_ = 0xffffffff;
  auVar63._0_8_ = 0xffffffffffffffff;
  auVar63._12_4_ = 0xffffffff;
  auVar68 = paddsw(auVar62,auVar63);
  auVar62._4_4_ = uVar48;
  auVar62._0_4_ = uVar48;
  auVar62._8_4_ = uVar48;
  auVar62._12_4_ = uVar48;
  auVar68 = psubsw(auVar68,auVar62);
  auVar86 = psubsw((undefined1  [16])0x0,auVar62);
  auVar56 = psubsw((undefined1  [16])p1p0,auVar62);
  auVar50 = psubsw((undefined1  [16])q1q0,auVar62);
  auVar71 = psubsw(auVar56,auVar50);
  sVar66 = auVar68._0_2_;
  sVar70 = auVar71._0_2_;
  uVar69 = (ushort)(sVar66 < sVar70) * sVar66 | (ushort)(sVar66 >= sVar70) * sVar70;
  sVar67 = auVar68._2_2_;
  sVar70 = auVar71._2_2_;
  uVar76 = (ushort)(sVar67 < sVar70) * sVar67 | (ushort)(sVar67 >= sVar70) * sVar70;
  sVar11 = auVar68._4_2_;
  sVar70 = auVar71._4_2_;
  uVar77 = (ushort)(sVar11 < sVar70) * sVar11 | (ushort)(sVar11 >= sVar70) * sVar70;
  sVar12 = auVar68._6_2_;
  sVar70 = auVar71._6_2_;
  uVar78 = (ushort)(sVar12 < sVar70) * sVar12 | (ushort)(sVar12 >= sVar70) * sVar70;
  sVar13 = auVar68._8_2_;
  sVar70 = auVar71._8_2_;
  uVar79 = (ushort)(sVar13 < sVar70) * sVar13 | (ushort)(sVar13 >= sVar70) * sVar70;
  sVar14 = auVar68._10_2_;
  sVar70 = auVar71._10_2_;
  uVar80 = (ushort)(sVar14 < sVar70) * sVar14 | (ushort)(sVar14 >= sVar70) * sVar70;
  sVar15 = auVar68._12_2_;
  sVar70 = auVar71._12_2_;
  sVar83 = auVar71._14_2_;
  uVar81 = (ushort)(sVar15 < sVar70) * sVar15 | (ushort)(sVar15 >= sVar70) * sVar70;
  sVar16 = auVar68._14_2_;
  uVar82 = (ushort)(sVar16 < sVar83) * sVar16 | (ushort)(sVar16 >= sVar83) * sVar83;
  sVar70 = auVar86._0_2_;
  auVar72._0_2_ = (ushort)((short)uVar69 < sVar70) * sVar70 | ((short)uVar69 >= sVar70) * uVar69;
  sVar83 = auVar86._2_2_;
  auVar72._2_2_ = (ushort)((short)uVar76 < sVar83) * sVar83 | ((short)uVar76 >= sVar83) * uVar76;
  sVar5 = auVar86._4_2_;
  auVar72._4_2_ = (ushort)((short)uVar77 < sVar5) * sVar5 | ((short)uVar77 >= sVar5) * uVar77;
  sVar6 = auVar86._6_2_;
  auVar72._6_2_ = (ushort)((short)uVar78 < sVar6) * sVar6 | ((short)uVar78 >= sVar6) * uVar78;
  sVar7 = auVar86._8_2_;
  auVar72._8_2_ = (ushort)((short)uVar79 < sVar7) * sVar7 | ((short)uVar79 >= sVar7) * uVar79;
  sVar8 = auVar86._10_2_;
  auVar72._10_2_ = (ushort)((short)uVar80 < sVar8) * sVar8 | ((short)uVar80 >= sVar8) * uVar80;
  sVar9 = auVar86._12_2_;
  auVar72._12_2_ = (ushort)((short)uVar81 < sVar9) * sVar9 | ((short)uVar81 >= sVar9) * uVar81;
  sVar10 = auVar86._14_2_;
  auVar72._14_2_ = (ushort)((short)uVar82 < sVar10) * sVar10 | ((short)uVar82 >= sVar10) * uVar82;
  auVar68 = psubsw(auVar72 >> 0x40 & (undefined1  [16])hev,auVar72);
  auVar68 = psubsw(auVar68,auVar72);
  auVar68 = psubsw(auVar68,auVar72);
  sVar47 = auVar68._0_2_;
  uVar69 = (ushort)(sVar66 < sVar47) * sVar66 | (ushort)(sVar66 >= sVar47) * sVar47;
  sVar47 = auVar68._2_2_;
  uVar76 = (ushort)(sVar67 < sVar47) * sVar67 | (ushort)(sVar67 >= sVar47) * sVar47;
  sVar47 = auVar68._4_2_;
  uVar77 = (ushort)(sVar11 < sVar47) * sVar11 | (ushort)(sVar11 >= sVar47) * sVar47;
  sVar47 = auVar68._6_2_;
  uVar78 = (ushort)(sVar12 < sVar47) * sVar12 | (ushort)(sVar12 >= sVar47) * sVar47;
  sVar47 = auVar68._8_2_;
  uVar79 = (ushort)(sVar13 < sVar47) * sVar13 | (ushort)(sVar13 >= sVar47) * sVar47;
  sVar47 = auVar68._10_2_;
  uVar80 = (ushort)(sVar14 < sVar47) * sVar14 | (ushort)(sVar14 >= sVar47) * sVar47;
  sVar47 = auVar68._12_2_;
  sVar52 = auVar68._14_2_;
  uVar81 = (ushort)(sVar15 < sVar47) * sVar15 | (ushort)(sVar15 >= sVar47) * sVar47;
  uVar82 = (ushort)(sVar16 < sVar52) * sVar16 | (ushort)(sVar16 >= sVar52) * sVar52;
  auVar84._0_2_ = (ushort)((short)uVar69 < sVar70) * sVar70 | ((short)uVar69 >= sVar70) * uVar69;
  auVar84._2_2_ = (ushort)((short)uVar76 < sVar83) * sVar83 | ((short)uVar76 >= sVar83) * uVar76;
  auVar84._4_2_ = (ushort)((short)uVar77 < sVar5) * sVar5 | ((short)uVar77 >= sVar5) * uVar77;
  auVar84._6_2_ = (ushort)((short)uVar78 < sVar6) * sVar6 | ((short)uVar78 >= sVar6) * uVar78;
  auVar84._8_2_ = (ushort)((short)uVar79 < sVar7) * sVar7 | ((short)uVar79 >= sVar7) * uVar79;
  auVar84._10_2_ = (ushort)((short)uVar80 < sVar8) * sVar8 | ((short)uVar80 >= sVar8) * uVar80;
  auVar84._12_2_ = (ushort)((short)uVar81 < sVar9) * sVar9 | ((short)uVar81 >= sVar9) * uVar81;
  auVar84._14_2_ = (ushort)((short)uVar82 < sVar10) * sVar10 | ((short)uVar82 >= sVar10) * uVar82;
  auVar84 = auVar84 & (undefined1  [16])mask;
  auVar73._0_8_ = auVar84._0_8_;
  auVar73._8_4_ = auVar84._0_4_;
  auVar73._12_4_ = auVar84._4_4_;
  auVar68 = paddsw(auVar73,_DAT_0046eac0);
  sVar47 = auVar68._0_2_;
  uVar69 = (ushort)(sVar66 < sVar47) * sVar66 | (ushort)(sVar66 >= sVar47) * sVar47;
  sVar47 = auVar68._2_2_;
  uVar76 = (ushort)(sVar67 < sVar47) * sVar67 | (ushort)(sVar67 >= sVar47) * sVar47;
  sVar47 = auVar68._4_2_;
  uVar77 = (ushort)(sVar11 < sVar47) * sVar11 | (ushort)(sVar11 >= sVar47) * sVar47;
  sVar47 = auVar68._6_2_;
  uVar78 = (ushort)(sVar12 < sVar47) * sVar12 | (ushort)(sVar12 >= sVar47) * sVar47;
  sVar47 = auVar68._8_2_;
  uVar79 = (ushort)(sVar13 < sVar47) * sVar13 | (ushort)(sVar13 >= sVar47) * sVar47;
  sVar47 = auVar68._10_2_;
  uVar80 = (ushort)(sVar14 < sVar47) * sVar14 | (ushort)(sVar14 >= sVar47) * sVar47;
  sVar47 = auVar68._12_2_;
  sVar52 = auVar68._14_2_;
  uVar81 = (ushort)(sVar15 < sVar47) * sVar15 | (ushort)(sVar15 >= sVar47) * sVar47;
  uVar82 = (ushort)(sVar16 < sVar52) * sVar16 | (ushort)(sVar16 >= sVar52) * sVar52;
  auVar74._0_2_ = (ushort)((short)uVar69 < sVar70) * sVar70 | ((short)uVar69 >= sVar70) * uVar69;
  auVar74._2_2_ = (ushort)((short)uVar76 < sVar83) * sVar83 | ((short)uVar76 >= sVar83) * uVar76;
  auVar74._4_2_ = (ushort)((short)uVar77 < sVar5) * sVar5 | ((short)uVar77 >= sVar5) * uVar77;
  auVar74._6_2_ = (ushort)((short)uVar78 < sVar6) * sVar6 | ((short)uVar78 >= sVar6) * uVar78;
  auVar74._8_2_ = (ushort)((short)uVar79 < sVar7) * sVar7 | ((short)uVar79 >= sVar7) * uVar79;
  auVar74._10_2_ = (ushort)((short)uVar80 < sVar8) * sVar8 | ((short)uVar80 >= sVar8) * uVar80;
  auVar74._12_2_ = (ushort)((short)uVar81 < sVar9) * sVar9 | ((short)uVar81 >= sVar9) * uVar81;
  auVar74._14_2_ = (ushort)((short)uVar82 < sVar10) * sVar10 | ((short)uVar82 >= sVar10) * uVar82;
  auVar68 = psraw(auVar74,3);
  auVar85._0_2_ = auVar68._0_2_ + 1;
  auVar85._2_2_ = auVar68._2_2_ + 1;
  auVar85._4_2_ = auVar68._4_2_ + 1;
  auVar85._6_2_ = auVar68._6_2_ + 1;
  auVar85._8_2_ = auVar68._0_2_ + 1;
  auVar85._10_2_ = auVar68._2_2_ + 1;
  auVar85._12_2_ = auVar68._4_2_ + 1;
  auVar85._14_2_ = auVar68._6_2_ + 1;
  auVar71 = psraw(auVar85,1);
  auVar64._8_8_ = SUB168(~(undefined1  [16])hev & auVar71,8);
  auVar64._0_8_ = auVar68._8_8_;
  auVar75._8_8_ = SUB168(~(undefined1  [16])hev & auVar71,0);
  auVar75._0_8_ = auVar68._0_8_;
  auVar68 = psubsw(auVar50,auVar75);
  auVar50 = paddsw(auVar64,auVar56);
  sVar47 = auVar68._0_2_;
  uVar69 = (ushort)(sVar66 < sVar47) * sVar66 | (ushort)(sVar66 >= sVar47) * sVar47;
  sVar47 = auVar68._2_2_;
  uVar76 = (ushort)(sVar67 < sVar47) * sVar67 | (ushort)(sVar67 >= sVar47) * sVar47;
  sVar47 = auVar68._4_2_;
  uVar77 = (ushort)(sVar11 < sVar47) * sVar11 | (ushort)(sVar11 >= sVar47) * sVar47;
  sVar47 = auVar68._6_2_;
  uVar78 = (ushort)(sVar12 < sVar47) * sVar12 | (ushort)(sVar12 >= sVar47) * sVar47;
  sVar47 = auVar68._8_2_;
  uVar79 = (ushort)(sVar13 < sVar47) * sVar13 | (ushort)(sVar13 >= sVar47) * sVar47;
  sVar47 = auVar68._10_2_;
  uVar80 = (ushort)(sVar14 < sVar47) * sVar14 | (ushort)(sVar14 >= sVar47) * sVar47;
  sVar47 = auVar68._12_2_;
  sVar52 = auVar68._14_2_;
  uVar81 = (ushort)(sVar15 < sVar47) * sVar15 | (ushort)(sVar15 >= sVar47) * sVar47;
  uVar82 = (ushort)(sVar16 < sVar52) * sVar16 | (ushort)(sVar16 >= sVar52) * sVar52;
  uVar48 = CONCAT22((ushort)((short)uVar76 < sVar83) * sVar83 | ((short)uVar76 >= sVar83) * uVar76,
                    (ushort)((short)uVar69 < sVar70) * sVar70 | ((short)uVar69 >= sVar70) * uVar69);
  auVar49._0_8_ =
       CONCAT26((ushort)((short)uVar78 < sVar6) * sVar6 | ((short)uVar78 >= sVar6) * uVar78,
                CONCAT24((ushort)((short)uVar77 < sVar5) * sVar5 | ((short)uVar77 >= sVar5) * uVar77
                         ,uVar48));
  auVar49._8_2_ = (ushort)((short)uVar79 < sVar7) * sVar7 | ((short)uVar79 >= sVar7) * uVar79;
  auVar49._10_2_ = (ushort)((short)uVar80 < sVar8) * sVar8 | ((short)uVar80 >= sVar8) * uVar80;
  auVar51._12_2_ = (ushort)((short)uVar81 < sVar9) * sVar9 | ((short)uVar81 >= sVar9) * uVar81;
  auVar51._0_12_ = auVar49;
  auVar51._14_2_ = (ushort)((short)uVar82 < sVar10) * sVar10 | ((short)uVar82 >= sVar10) * uVar82;
  sVar47 = auVar50._0_2_;
  uVar69 = (ushort)(sVar66 < sVar47) * sVar66 | (ushort)(sVar66 >= sVar47) * sVar47;
  sVar66 = auVar50._2_2_;
  uVar76 = (ushort)(sVar67 < sVar66) * sVar67 | (ushort)(sVar67 >= sVar66) * sVar66;
  sVar66 = auVar50._4_2_;
  uVar77 = (ushort)(sVar11 < sVar66) * sVar11 | (ushort)(sVar11 >= sVar66) * sVar66;
  sVar66 = auVar50._6_2_;
  uVar78 = (ushort)(sVar12 < sVar66) * sVar12 | (ushort)(sVar12 >= sVar66) * sVar66;
  sVar66 = auVar50._8_2_;
  uVar79 = (ushort)(sVar13 < sVar66) * sVar13 | (ushort)(sVar13 >= sVar66) * sVar66;
  sVar66 = auVar50._10_2_;
  uVar80 = (ushort)(sVar14 < sVar66) * sVar14 | (ushort)(sVar14 >= sVar66) * sVar66;
  sVar66 = auVar50._12_2_;
  sVar67 = auVar50._14_2_;
  uVar81 = (ushort)(sVar15 < sVar66) * sVar15 | (ushort)(sVar15 >= sVar66) * sVar66;
  uVar82 = (ushort)(sVar16 < sVar67) * sVar16 | (ushort)(sVar16 >= sVar67) * sVar67;
  uVar57 = CONCAT22((ushort)((short)uVar76 < sVar83) * sVar83 | ((short)uVar76 >= sVar83) * uVar76,
                    (ushort)((short)uVar69 < sVar70) * sVar70 | ((short)uVar69 >= sVar70) * uVar69);
  auVar58._0_8_ =
       CONCAT26((ushort)((short)uVar78 < sVar6) * sVar6 | ((short)uVar78 >= sVar6) * uVar78,
                CONCAT24((ushort)((short)uVar77 < sVar5) * sVar5 | ((short)uVar77 >= sVar5) * uVar77
                         ,uVar57));
  auVar58._8_2_ = (ushort)((short)uVar79 < sVar7) * sVar7 | ((short)uVar79 >= sVar7) * uVar79;
  auVar58._10_2_ = (ushort)((short)uVar80 < sVar8) * sVar8 | ((short)uVar80 >= sVar8) * uVar80;
  auVar65._12_2_ = (ushort)((short)uVar81 < sVar9) * sVar9 | ((short)uVar81 >= sVar9) * uVar81;
  auVar65._0_12_ = auVar58;
  auVar65._14_2_ = (ushort)((short)uVar82 < sVar10) * sVar10 | ((short)uVar82 >= sVar10) * uVar82;
  auVar71._4_4_ = auVar58._8_4_;
  auVar71._0_4_ = uVar57;
  auVar71._8_4_ = (int)((ulong)auVar58._0_8_ >> 0x20);
  auVar71._12_4_ = auVar65._12_4_;
  auVar68 = pshuflw(auVar71,auVar71,0x72);
  auVar68 = pshufhw(auVar68,auVar68,0x72);
  auVar50 = pshuflw(auVar56,auVar62,0x72);
  auVar50 = pshufhw(auVar50,auVar50,0x72);
  auVar50 = paddsw(auVar50,auVar68);
  auVar86._4_4_ = auVar49._8_4_;
  auVar86._0_4_ = uVar48;
  auVar86._8_4_ = (int)((ulong)auVar49._0_8_ >> 0x20);
  auVar86._12_4_ = auVar51._12_4_;
  auVar68 = pshuflw(auVar86,auVar86,0xd8);
  auVar68 = pshufhw(auVar68,auVar68,0xd8);
  auVar62 = pshuflw(auVar51,auVar62,0xd8);
  auVar62 = pshufhw(auVar62,auVar62,0xd8);
  auVar62 = paddsw(auVar62,auVar68);
  *(ulong *)(s + -2) = CONCAT44(auVar62._0_4_,auVar50._0_4_);
  *(ulong *)(s + (long)p + -2) = CONCAT44(auVar62._4_4_,auVar50._4_4_);
  *(ulong *)(s + (long)(p * 2) + -2) = CONCAT44(auVar62._8_4_,auVar50._8_4_);
  *(ulong *)(s + (long)(p * 3) + -2) = CONCAT44(auVar62._12_4_,auVar50._12_4_);
  return;
}

Assistant:

void aom_highbd_lpf_vertical_4_sse2(uint16_t *s, int p, const uint8_t *blimit,
                                    const uint8_t *limit, const uint8_t *thresh,
                                    int bd) {
  __m128i x0, x1, x2, x3, d0, d1, d2, d3;
  __m128i p1p0, q1q0;
  __m128i p1, q1;

  x0 = _mm_loadl_epi64((__m128i *)(s - 2 + 0 * p));
  x1 = _mm_loadl_epi64((__m128i *)(s - 2 + 1 * p));
  x2 = _mm_loadl_epi64((__m128i *)(s - 2 + 2 * p));
  x3 = _mm_loadl_epi64((__m128i *)(s - 2 + 3 * p));

  highbd_transpose4x8_8x4_low_sse2(&x0, &x1, &x2, &x3, &d0, &d1, &d2, &d3);

  highbd_lpf_internal_4_sse2(&d0, &d1, &d2, &d3, &q1q0, &p1p0, blimit, limit,
                             thresh, bd);

  p1 = _mm_srli_si128(p1p0, 8);
  q1 = _mm_srli_si128(q1q0, 8);

  // transpose from 8x4 to 4x8
  highbd_transpose4x8_8x4_low_sse2(&p1, &p1p0, &q1q0, &q1, &d0, &d1, &d2, &d3);

  _mm_storel_epi64((__m128i *)(s - 2 + 0 * p), d0);
  _mm_storel_epi64((__m128i *)(s - 2 + 1 * p), d1);
  _mm_storel_epi64((__m128i *)(s - 2 + 2 * p), d2);
  _mm_storel_epi64((__m128i *)(s - 2 + 3 * p), d3);
}